

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O0

void __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::~ThreeAxisForceTorqueContactSensor
          (ThreeAxisForceTorqueContactSensor *this)

{
  undefined8 *in_RDI;
  ThreeAxisForceTorqueContactSensorPrivateAttributes *this_00;
  
  *in_RDI = &PTR__ThreeAxisForceTorqueContactSensor_004fab18;
  this_00 = (ThreeAxisForceTorqueContactSensorPrivateAttributes *)in_RDI[1];
  if (this_00 != (ThreeAxisForceTorqueContactSensorPrivateAttributes *)0x0) {
    ThreeAxisForceTorqueContactSensorPrivateAttributes::
    ~ThreeAxisForceTorqueContactSensorPrivateAttributes(this_00);
    operator_delete(this_00,0xc0);
  }
  LinkSensor::~LinkSensor((LinkSensor *)0x48d721);
  return;
}

Assistant:

ThreeAxisForceTorqueContactSensor::~ThreeAxisForceTorqueContactSensor()
{
    delete this->pimpl;
}